

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arraylist.c
# Opt level: O0

void array_list_free(array_list *arr)

{
  ulong local_18;
  size_t i;
  array_list *arr_local;
  
  for (local_18 = 0; local_18 < arr->length; local_18 = local_18 + 1) {
    if (arr->array[local_18] != (void *)0x0) {
      (*arr->free_fn)(arr->array[local_18]);
    }
  }
  free(arr->array);
  free(arr);
  return;
}

Assistant:

extern void array_list_free(struct array_list *arr)
{
	size_t i;
	for (i = 0; i < arr->length; i++)
		if (arr->array[i])
			arr->free_fn(arr->array[i]);
	free(arr->array);
	free(arr);
}